

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Report_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::IO_Report_PDU::IO_Report_PDU
          (IO_Report_PDU *this,EntityIdentifier *OrigID,KUINT16 SimSrc,IOReportType RT,
          EntityIdentifier *AtkID,EntityIdentifier *TgtID)

{
  EntityIdentifier *TgtID_local;
  EntityIdentifier *AtkID_local;
  IOReportType RT_local;
  KUINT16 SimSrc_local;
  EntityIdentifier *OrigID_local;
  IO_Report_PDU *this_local;
  
  IO_Header::IO_Header(&this->super_IO_Header,OrigID);
  (this->super_IO_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__IO_Report_PDU_0033aca0;
  this->m_ui16SimSrc = SimSrc;
  this->m_ui8RptTyp = (KUINT8)RT;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_AtkEntityID,AtkID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_TgtEntityID,TgtID);
  this->m_ui32Padding = 0;
  this->m_ui16NumStdVarRec = 0;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::vector(&this->m_vStdVarRecs);
  (this->super_IO_Header).super_Header.super_Header6.m_ui8PDUType = 'G';
  (this->super_IO_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

IO_Report_PDU::IO_Report_PDU( const EntityIdentifier & OrigID, KUINT16 SimSrc, IOReportType RT, const EntityIdentifier & AtkID, const EntityIdentifier & TgtID ) :
    IO_Header( OrigID ),
    m_ui16SimSrc( SimSrc ),
    m_ui8RptTyp( RT ),
    m_ui32Padding( 0 ),
    m_AtkEntityID( AtkID ),
    m_TgtEntityID( TgtID ),
    m_ui16NumStdVarRec( 0 )
{
    m_ui8PDUType = IO_Report_PDU_Type;
    m_ui16PDULength = IO_REPORT_PDU_SIZE;
}